

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

void __thiscall
google::
sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::swap(sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *this,sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *ht)

{
  type tVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  float fVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 uVar18;
  uint uVar19;
  Settings __tmp;
  
  sVar3 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          enlarge_threshold_;
  sVar4 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          shrink_threshold_;
  fVar13 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           enlarge_factor_;
  fVar14 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           shrink_factor_;
  bVar15 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           consider_shrink_;
  bVar16 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           use_empty_;
  bVar17 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           use_deleted_;
  uVar18 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           field_0x1b;
  uVar19 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           num_ht_copies_;
  sVar5 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          enlarge_threshold_;
  sVar6 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          shrink_threshold_;
  fVar7 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          shrink_factor_;
  bVar8 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          consider_shrink_;
  bVar9 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          use_empty_;
  bVar10 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           use_deleted_;
  uVar11 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           field_0x1b;
  uVar12 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_factor_ =
       (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
       enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.shrink_factor_
       = fVar7;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = bVar8;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_empty_ =
       bVar9;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_ =
       bVar10;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.field_0x1b =
       uVar11;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.num_ht_copies_
       = uVar12;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ = sVar5;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = sVar6;
  (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.enlarge_factor_
       = fVar13;
  (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.shrink_factor_ =
       fVar14;
  (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.consider_shrink_
       = bVar15;
  (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_empty_ =
       bVar16;
  (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_ =
       bVar17;
  (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.field_0x1b =
       uVar18;
  (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.num_ht_copies_ =
       uVar19;
  (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ = sVar3;
  (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = sVar4;
  tVar1 = (this->key_info).delkey;
  (this->key_info).delkey = (ht->key_info).delkey;
  (ht->key_info).delkey = tVar1;
  sVar2 = this->num_deleted;
  this->num_deleted = ht->num_deleted;
  ht->num_deleted = sVar2;
  sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::swap(&this->table,&ht->table);
  sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::
  reset_thresholds((sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *)this,
                   (this->table).settings.table_size);
  sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::
  reset_thresholds((sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *)ht,
                   (ht->table).settings.table_size);
  return;
}

Assistant:

void swap(sparse_hashtable& ht) {
    std::swap(settings, ht.settings);
    std::swap(key_info, ht.key_info);
    std::swap(num_deleted, ht.num_deleted);
    table.swap(ht.table);
    settings.reset_thresholds(bucket_count());  // also resets consider_shrink
    ht.settings.reset_thresholds(ht.bucket_count());
    // we purposefully don't swap the allocator, which may not be swap-able
  }